

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

LineTable * __thiscall
llvm::DWARFDebugLine::SectionParser::parseNext
          (LineTable *__return_storage_ptr__,SectionParser *this,
          function_ref<void_(llvm::Error)> RecoverableErrorCallback,
          function_ref<void_(llvm::Error)> UnrecoverableErrorCallback,raw_ostream *OS)

{
  uint64_t uVar1;
  DWARFUnit *RecoverableErrorCallback_00;
  ulong uVar2;
  ulong uVar3;
  raw_ostream local_88;
  undefined1 local_60 [8];
  function_ref<void_(llvm::Error)> UnrecoverableErrorCallback_local;
  Error local_40;
  ulong local_38;
  Error Err;
  
  UnrecoverableErrorCallback_local.callback =
       (_func_void_intptr_t_Error *)UnrecoverableErrorCallback.callable;
  local_60 = (undefined1  [8])UnrecoverableErrorCallback.callback;
  UnrecoverableErrorCallback_local.callable = RecoverableErrorCallback.callable;
  if (this->Offset < (this->DebugLineData->super_DataExtractor).Data.Length) {
    RecoverableErrorCallback_00 = prepareToParse(this,this->Offset);
    uVar1 = this->Offset;
    LineTable::LineTable(__return_storage_ptr__);
    local_88.OutBufStart = (char *)UnrecoverableErrorCallback_local.callable;
    local_88.OutBufCur =
         (char *)std::_Function_handler<void_(llvm::Error),_llvm::function_ref<void_(llvm::Error)>_>
                 ::_M_invoke;
    local_88.OutBufEnd =
         (char *)std::_Function_handler<void_(llvm::Error),_llvm::function_ref<void_(llvm::Error)>_>
                 ::_M_manager;
    local_88._vptr_raw_ostream = (_func_int **)RecoverableErrorCallback.callback;
    LineTable::parse((LineTable *)&stack0xffffffffffffffc8,
                     (DWARFDataExtractor *)__return_storage_ptr__,(uint64_t *)this->DebugLineData,
                     (DWARFContext *)&this->Offset,(DWARFUnit *)this->Context,
                     (function<void_(llvm::Error)> *)RecoverableErrorCallback_00,&local_88);
    if ((code *)local_88.OutBufEnd != (code *)0x0) {
      (*(code *)local_88.OutBufEnd)(&local_88,&local_88,3);
    }
    uVar3 = local_38 & 0xfffffffffffffffe;
    uVar2 = uVar3 != 0 | uVar3;
    if (uVar3 != 0) {
      local_40.Payload = (ErrorInfoBase *)(local_38 | 1);
      local_38 = 0;
      function_ref<void_(llvm::Error)>::operator()
                ((function_ref<void_(llvm::Error)> *)local_60,&local_40);
      uVar2 = local_38;
      if ((long *)((ulong)local_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_40.Payload & 0xfffffffffffffffe) + 8))();
        uVar2 = local_38;
      }
    }
    local_38 = uVar2;
    if ((long *)(local_38 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_38 & 0xfffffffffffffffe) + 8))();
    }
    uVar2 = (__return_storage_ptr__->Prologue).TotalLength;
    if ((uVar2 != 0xffffffff && 0xffffffe < uVar2 >> 4) ||
       (uVar2 = uVar2 + uVar1 +
                (ulong)((__return_storage_ptr__->Prologue).FormParams.Format == DWARF64) * 8 + 4,
       this->Offset = uVar2, (this->DebugLineData->super_DataExtractor).Data.Length <= uVar2)) {
      this->Done = true;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("DebugLineData.isValidOffset(Offset) && \"parsing should have terminated\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                ,0x46f,
                "DWARFDebugLine::LineTable llvm::DWARFDebugLine::SectionParser::parseNext(function_ref<void (Error)>, function_ref<void (Error)>, raw_ostream *)"
               );
}

Assistant:

DWARFDebugLine::LineTable DWARFDebugLine::SectionParser::parseNext(
    function_ref<void(Error)> RecoverableErrorCallback,
    function_ref<void(Error)> UnrecoverableErrorCallback, raw_ostream *OS) {
  assert(DebugLineData.isValidOffset(Offset) &&
         "parsing should have terminated");
  DWARFUnit *U = prepareToParse(Offset);
  uint64_t OldOffset = Offset;
  LineTable LT;
  if (Error Err = LT.parse(DebugLineData, &Offset, Context, U,
                           RecoverableErrorCallback, OS))
    UnrecoverableErrorCallback(std::move(Err));
  moveToNextTable(OldOffset, LT.Prologue);
  return LT;
}